

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

void __thiscall HEkk::initialiseEkk(HEkk *this)

{
  if ((this->status_).initialised_for_new_lp == false) {
    setSimplexOptions(this);
    initialiseControl(this);
    initialiseSimplexLpRandomVectors(this);
    HSimplexNla::clear(&this->simplex_nla_);
    clearBadBasisChange(this,kAll);
    (this->status_).initialised_for_new_lp = true;
  }
  return;
}

Assistant:

void HEkk::initialiseEkk() {
  if (status_.initialised_for_new_lp) return;
  setSimplexOptions();
  initialiseControl();
  initialiseSimplexLpRandomVectors();
  simplex_nla_.clear();
  clearBadBasisChange();
  status_.initialised_for_new_lp = true;
}